

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O0

int __thiscall
AbstractThresholdConditionChecker::GetStateSinceHeightFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  long lVar1;
  ThresholdState height;
  undefined4 uVar2;
  ThresholdState TVar3;
  CBlockIndex *this_00;
  CBlockIndex **ppCVar4;
  undefined8 in_RCX;
  char *in_RDX;
  CBlockIndex **in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  CBlockIndex *previousPeriodParent;
  int nPeriod;
  ThresholdState initialState;
  int64_t start_time;
  ThresholdConditionCache *in_stack_00000060;
  Params *in_stack_00000068;
  AbstractThresholdConditionChecker *in_stack_00000070;
  CBlockIndex *in_stack_00000098;
  CBlockIndex *local_50;
  int line;
  CBlockIndex *pCVar6;
  int local_14;
  
  line = (int)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CBlockIndex *)(**(code **)(*in_RDI + 8))(in_RDI,in_RDX);
  if ((this_00 == (CBlockIndex *)0xffffffffffffffff) ||
     (this_00 == (CBlockIndex *)0xfffffffffffffffe)) {
    local_14 = 0;
  }
  else {
    height = GetStateFor(in_stack_00000070,in_stack_00000098,in_stack_00000068,in_stack_00000060);
    if (height == DEFINED) {
      local_14 = 0;
    }
    else {
      uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RDX);
      CBlockIndex::GetAncestor(this_00,height);
      ppCVar4 = inline_assertion_check<true,CBlockIndex_const*>
                          (in_RSI,in_RDX,line,(char *)this_00,(char *)CONCAT44(height,uVar2));
      pCVar6 = *ppCVar4;
      local_50 = CBlockIndex::GetAncestor(this_00,height);
      while( true ) {
        bVar5 = false;
        if (local_50 != (CBlockIndex *)0x0) {
          TVar3 = GetStateFor(in_stack_00000070,in_stack_00000098,in_stack_00000068,
                              in_stack_00000060);
          bVar5 = TVar3 == height;
        }
        if (!bVar5) break;
        pCVar6 = local_50;
        local_50 = CBlockIndex::GetAncestor(this_00,height);
      }
      local_14 = pCVar6->nHeight + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int AbstractThresholdConditionChecker::GetStateSinceHeightFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int64_t start_time = BeginTime(params);
    if (start_time == Consensus::BIP9Deployment::ALWAYS_ACTIVE || start_time == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return 0;
    }

    const ThresholdState initialState = GetStateFor(pindexPrev, params, cache);

    // BIP 9 about state DEFINED: "The genesis block is by definition in this state for each deployment."
    if (initialState == ThresholdState::DEFINED) {
        return 0;
    }

    const int nPeriod = Period(params);

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    // To ease understanding of the following height calculation, it helps to remember that
    // right now pindexPrev points to the block prior to the block that we are computing for, thus:
    // if we are computing for the last block of a period, then pindexPrev points to the second to last block of the period, and
    // if we are computing for the first block of a period, then pindexPrev points to the last block of the previous period.
    // The parent of the genesis block is represented by nullptr.
    pindexPrev = Assert(pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod)));

    const CBlockIndex* previousPeriodParent = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);

    while (previousPeriodParent != nullptr && GetStateFor(previousPeriodParent, params, cache) == initialState) {
        pindexPrev = previousPeriodParent;
        previousPeriodParent = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // Adjust the result because right now we point to the parent block.
    return pindexPrev->nHeight + 1;
}